

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O0

void __thiscall estl::shared_ptr<MyClass>::decrease_counters(shared_ptr<MyClass> *this)

{
  __int_type _Var1;
  shared_ptr<MyClass> *this_local;
  
  if ((this->ptr_ != (MyClass *)0x0) && (this->control_block_ptr_ != (control_block *)0x0)) {
    std::operator<<((ostream *)&std::cerr,"decref() ");
    control_block::dbg(this->control_block_ptr_);
    _Var1 = std::__atomic_base<unsigned_int>::operator--
                      ((__atomic_base<unsigned_int> *)this->control_block_ptr_);
    if (_Var1 == 0) {
      destroy(this);
    }
    _Var1 = std::__atomic_base<unsigned_int>::operator--
                      (&(this->control_block_ptr_->control_block_count_).
                        super___atomic_base<unsigned_int>);
    if (_Var1 == 0) {
      destroy_control_block(this);
    }
  }
  return;
}

Assistant:

void decrease_counters()
    {
        if (!ptr_ || !control_block_ptr_) {
            return;
        }

        std::cerr << "decref() "; control_block_ptr_->dbg();
        if (--(control_block_ptr_->use_count_) == 0) {
            destroy();
        }
        if (--(control_block_ptr_->control_block_count_) == 0) {
            destroy_control_block();
        }
    }